

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Option<Catch::TestRunInfo>::reset(Option<Catch::TestRunInfo> *this)

{
  if ((string *)this->nullableValue != (string *)0x0) {
    std::__cxx11::string::~string((string *)this->nullableValue);
  }
  this->nullableValue = (TestRunInfo *)0x0;
  return;
}

Assistant:

void reset() {
            if( nullableValue )
                nullableValue->~T();
            nullableValue = nullptr;
        }